

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall despot::util::tinyxml::TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlComment *comment)

{
  TiXmlString *this_00;
  
  DoIndent(this);
  this_00 = &this->buffer;
  TiXmlString::operator+=(this_00,"<!--");
  TiXmlString::operator+=(this_00,((comment->super_TiXmlNode).value.rep_)->str);
  TiXmlString::operator+=(this_00,"-->");
  DoLineBreak(this);
  return true;
}

Assistant:

bool TiXmlPrinter::Visit(const TiXmlComment& comment) {
	DoIndent();
	buffer += "<!--";
	buffer += comment.Value();
	buffer += "-->";
	DoLineBreak();
	return true;
}